

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O1

ztresult_t savehandler_index(char *name,ztindex_t index,void *opaque)

{
  if (index == 0xffffffffffffffff) {
    emitf((savestate_t *)opaque,"%s = nil;\n",name);
  }
  else {
    emitf((savestate_t *)opaque,"%s = %d;\n",name,index);
  }
  return 0;
}

Assistant:

static ztresult_t savehandler_index(const char *name,
                                    ztindex_t   index,
                                    void       *opaque)
{
  savestate_t *state = opaque;
  if (index == ULONG_MAX)
    emitf(state, "%s = nil;\n", name);
  else
    emitf(state, "%s = %d;\n", name, index);
  return ztresult_OK;
}